

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckInternalVariables.cxx
# Opt level: O2

string * __thiscall
kws::Parser::FindInternalVariable_abi_cxx11_
          (string *__return_storage_ptr__,Parser *this,size_t start,size_t end,size_t *pos)

{
  string *psVar1;
  pointer pcVar2;
  ulong pos_00;
  size_t sVar3;
  char cVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  string subphrase;
  string local_50 [32];
  
  psVar1 = &this->m_BufferNoComment;
  pos_00 = std::__cxx11::string::find((char *)psVar1,0x161d46);
LAB_00142a69:
  if (end <= pos_00) {
    *pos = 0xffffffffffffffff;
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&subphrase);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&subphrase);
  bVar9 = true;
  uVar6 = pos_00;
LAB_00142a8b:
  bVar5 = true;
  uVar8 = uVar6;
  do {
    uVar6 = uVar6 - 1;
    if ((uVar6 == 0xffffffffffffffff) || (!bVar5)) {
      *pos = pos_00;
      pcVar2 = (psVar1->_M_dataplus)._M_p;
      break;
    }
    cVar4 = (psVar1->_M_dataplus)._M_p[uVar6];
    bVar5 = bVar9;
    if (cVar4 != '\t') {
      if (cVar4 == '\n') {
LAB_00142ad4:
        bVar5 = false;
      }
      else if (cVar4 != ' ') {
        if ((cVar4 == ')') || (cVar4 == '}')) goto LAB_00142ad4;
        bVar5 = false;
        if (cVar4 != ']') goto LAB_00142ae1;
      }
    }
    uVar8 = uVar8 - 1;
  } while( true );
LAB_00142b28:
  if (uVar8 == 0) goto LAB_00142b5b;
  cVar4 = pcVar2[uVar8 - 1];
  if (cVar4 == ':') {
    if ((pcVar2[uVar8 - 2] != ':') && (pcVar2[uVar8] != ':')) goto LAB_00142b9e;
  }
  else if ((cVar4 == ';') || (cVar4 == '}')) goto LAB_00142b5e;
  uVar8 = uVar8 - 1;
  goto LAB_00142b28;
LAB_00142b5b:
  cVar4 = pcVar2[-1];
LAB_00142b5e:
  if (cVar4 == '}') {
    sVar3 = FindOpeningChar(this,'}','{',uVar8 - 1,true);
    for (lVar7 = sVar3 + 1; (lVar7 != 1 && ((psVar1->_M_dataplus)._M_p[lVar7 + -1] != ';'));
        lVar7 = lVar7 + -1) {
    }
    std::__cxx11::string::substr((ulong)&subphrase,(ulong)psVar1);
    lVar7 = std::__cxx11::string::find((char *)&subphrase,0x162508);
    std::__cxx11::string::~string((string *)&subphrase);
    bVar9 = true;
    if (lVar7 == -1) {
      std::__cxx11::string::substr((ulong)&subphrase,(ulong)psVar1);
      lVar7 = std::__cxx11::string::find((char *)&subphrase,0x1623fb);
      bVar9 = lVar7 != -1;
      std::__cxx11::string::~string((string *)&subphrase);
    }
  }
  else {
LAB_00142b9e:
    bVar9 = false;
  }
  std::__cxx11::string::string((string *)&subphrase,"",(allocator *)local_50);
  std::__cxx11::string::substr((ulong)local_50,(ulong)psVar1);
  std::__cxx11::string::operator=((string *)&subphrase,local_50);
  std::__cxx11::string::~string(local_50);
  lVar7 = std::__cxx11::string::find((char *)&subphrase,0x162aa9);
  if (((((((lVar7 != -1) ||
          (lVar7 = std::__cxx11::string::find((char *)&subphrase,0x161d52), lVar7 != -1)) ||
         (lVar7 = std::__cxx11::string::find((char *)&subphrase,0x1623fb), lVar7 != -1)) ||
        ((lVar7 = std::__cxx11::string::find((char *)&subphrase,0x1596f8), lVar7 != -1 ||
         (lVar7 = std::__cxx11::string::find((char *)&subphrase,0x1627ec), lVar7 != -1)))) ||
       ((lVar7 = std::__cxx11::string::find((char *)&subphrase,0x162916), lVar7 != -1 ||
        ((lVar7 = std::__cxx11::string::find((char *)&subphrase,0x162512), lVar7 != -1 ||
         (lVar7 = std::__cxx11::string::find((char *)&subphrase,0x1627f3), lVar7 != -1)))))) ||
      (lVar7 = std::__cxx11::string::find((char *)&subphrase,0x1636eb), lVar7 != -1)) ||
     ((lVar7 = std::__cxx11::string::find((char *)&subphrase,0x162487), bVar9 || lVar7 != -1 ||
      (bVar9 = IsInFunction(this,pos_00,(char *)0x0), bVar9)))) {
    pos_00 = std::__cxx11::string::find((char *)psVar1,0x161d46);
    bVar5 = true;
    bVar9 = false;
  }
  else {
    lVar7 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,0x1545ee);
    bVar9 = true;
    if (lVar7 != -1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_50);
      std::__cxx11::string::~string(local_50);
    }
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)&subphrase);
  if (!bVar9) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  goto LAB_00142a69;
LAB_00142ae1:
  std::__cxx11::string::string((string *)&subphrase,(string *)__return_storage_ptr__);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,(psVar1->_M_dataplus)._M_p[uVar6]);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&subphrase);
  bVar9 = false;
  goto LAB_00142a8b;
}

Assistant:

std::string Parser::FindInternalVariable(size_t start, size_t end,size_t & pos)
{
  size_t posSemicolon = m_BufferNoComment.find(";",start);
  while(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We try to find the word before that
    unsigned long i=static_cast<unsigned long>(posSemicolon)-1;
    bool inWord = true;
    bool first = false;
    std::string ivar = "";
    while(i != std::string::npos && inWord)
      {
      if((m_BufferNoComment[i] != ' ')
         && (m_BufferNoComment[i] != '\t')
        )
        {
        if((m_BufferNoComment[i] == '}')
          || (m_BufferNoComment[i] == ')')
          || (m_BufferNoComment[i] == ']')
          || (m_BufferNoComment[i] == '\n')
          )
          {
          inWord = false;
          }
        else
          {
          std::string store = ivar;
          ivar = m_BufferNoComment[i];
          ivar += store;
          inWord = true;
          first = true;
          }
        }
      else // we have a space
        {
        if(first)
          {
          inWord = false;
          }
        }
      i--;
      }
    pos = posSemicolon;
    // We extract the complete definition.
    // This means that we look for a '{' or '}' or '{' or ':'
    // but not '::'
    while(i != std::string::npos)
      {
      if(m_BufferNoComment[i] == ';'
        || m_BufferNoComment[i] == '}'
        )
        {
        break;
        }
      else if(m_BufferNoComment[i] == ':')
        {
        if((m_BufferNoComment[i-1] != ':') && (m_BufferNoComment[i+1] != ':'))
          {
          break;
          }
        }
      i--;
      }

    bool isenum = false;
    // If we have a '}' we check that this is not an enum definition
    // or a typedef
    if(m_BufferNoComment[i] == '}')
      {

      // Find the opening char
      size_t j = this->FindOpeningChar('}','{',i,true);
      // Find a semicolon before that
      while(j>0)
        {
        if(m_BufferNoComment[j] == ';')
          {
          break;
          }
        j--;
        }

      if(m_BufferNoComment.substr(j+1,i-j-1).find("enum") != std::string::npos)
        {
        isenum = true;
        }
      else if(m_BufferNoComment.substr(j+1,i-j-1).find("typedef") != std::string::npos)
        {
        isenum = true;
        }
     }

    std::string subphrase = "";
    subphrase = m_BufferNoComment.substr(i+1,posSemicolon-i-1);

    if( (subphrase.find("=") == std::string::npos)
      && (subphrase.find("(") == std::string::npos)
      && (subphrase.find("typedef") == std::string::npos)
      && (subphrase.find("}") == std::string::npos)
      && (subphrase.find("friend") == std::string::npos)
      && (subphrase.find("class") == std::string::npos)
      && (subphrase.find("return") == std::string::npos)
      && (subphrase.find("extern") == std::string::npos)
      && (subphrase.find("\"") == std::string::npos)
      && (subphrase.find("<<") == std::string::npos)
      && !isenum
      )
      {
      // Check that we are not inside a function(){}
      if(!this->IsInFunction(posSemicolon))
        {
        // We check if any * is present and strip
        // the work
        size_t posstar = ivar.find_last_of("*");
        if(posstar != std::string::npos)
          {
          ivar = ivar.substr(posstar+1,ivar.size()-posstar-1);
          }
        return ivar;
        }
      }
    posSemicolon = m_BufferNoComment.find(";",posSemicolon+1);
    }

  pos = std::string::npos;
  return "";
}